

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gates.cpp
# Opt level: O1

void __thiscall
CaDiCaL::Internal::find_if_then_else(Internal *this,Eliminator *eliminator,int pivot)

{
  pointer *pppCVar1;
  int64_t *piVar2;
  pointer pvVar3;
  Clause *d;
  iterator iVar4;
  int a;
  bool bVar5;
  uint uVar6;
  Clause *pCVar8;
  Eliminator *pEVar9;
  int iVar10;
  pointer ppCVar11;
  int c;
  int cj;
  int bj;
  int aj;
  int ai;
  int ci;
  int bi;
  Clause *d2;
  Clause *d1;
  Clause *dj;
  Clause *di;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  Internal *local_98;
  Eliminator *local_90;
  int local_84;
  vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  pointer local_68;
  pointer local_60;
  Clause *local_58;
  Clause *local_50;
  Clause *local_48;
  Clause *local_40;
  pointer local_38;
  int iVar7;
  
  if (((((this->opts).elimites != 0) && (this->unsat == false)) && (this->vals[pivot] == '\0')) &&
     ((eliminator->gates).super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (eliminator->gates).super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_78 = -pivot;
    iVar7 = pivot;
    if (pivot < 1) {
      iVar7 = local_78;
    }
    uVar6 = iVar7 << 1 | (uint)pivot >> 0x1f;
    pvVar3 = (this->otab).
             super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = pvVar3[uVar6].
               super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_60 = *(pointer *)
                ((long)&pvVar3[uVar6].
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data + 8);
    if (local_38 != local_60) {
      local_80 = (vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *)&eliminator->gates;
      local_a4 = pivot;
      local_98 = this;
      local_90 = eliminator;
      local_68 = local_38;
      do {
        local_68 = local_68 + 1;
        local_40 = *local_38;
        bVar5 = get_ternary_clause(this,local_40,&local_a8,&local_9c,&local_a0);
        iVar7 = local_a8;
        uVar6 = 0;
        if (bVar5) {
          if (local_9c == pivot) {
            local_a8 = local_9c;
            local_9c = iVar7;
          }
          iVar7 = local_a8;
          if (local_a0 == pivot) {
            local_a8 = local_a0;
            local_a0 = iVar7;
          }
          local_84 = local_9c;
          local_6c = -local_9c;
          if (0 < local_9c) {
            local_6c = local_9c;
          }
          local_74 = -local_a0;
          ppCVar11 = local_68;
          local_70 = local_a0;
          if (local_a0 < 1) {
            local_70 = local_74;
          }
          do {
            if (ppCVar11 == local_60) {
              uVar6 = 5;
              break;
            }
            d = *ppCVar11;
            local_48 = d;
            bVar5 = get_ternary_clause(this,d,&local_ac,&local_b0,&local_b4);
            a = local_78;
            iVar7 = local_ac;
            uVar6 = 7;
            if (bVar5) {
              if (local_b0 == pivot) {
                local_ac = local_b0;
                local_b0 = iVar7;
              }
              iVar10 = local_ac;
              iVar7 = local_b0;
              if (local_b4 == pivot) {
                local_ac = local_b4;
                local_b4 = iVar10;
              }
              iVar10 = -local_b4;
              if (0 < local_b4) {
                iVar10 = local_b4;
              }
              if (local_6c == iVar10) {
                local_b0 = local_b4;
                local_b4 = iVar7;
              }
              iVar7 = local_b0;
              c = -local_b4;
              iVar10 = local_b4;
              if (local_b4 < 1) {
                iVar10 = c;
              }
              if ((local_70 != iVar10) && (local_84 + local_b0 == 0)) {
                pCVar8 = find_ternary_clause(this,local_78,local_84,local_74);
                local_50 = pCVar8;
                if ((pCVar8 == (Clause *)0x0) ||
                   (local_58 = find_ternary_clause(local_98,a,iVar7,c), pEVar9 = local_90,
                   local_58 == (Clause *)0x0)) {
                  uVar6 = 7;
                  this = local_98;
                  pivot = local_a4;
                }
                else {
                  *(uint *)&local_40->field_0x8 = *(uint *)&local_40->field_0x8 | 0x20;
                  d->field_0x8 = d->field_0x8 | 0x20;
                  pCVar8->field_0x8 = pCVar8->field_0x8 | 0x20;
                  local_58->field_0x8 = local_58->field_0x8 | 0x20;
                  iVar4._M_current =
                       (local_90->gates).
                       super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (local_90->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                    _M_realloc_insert<CaDiCaL::Clause*const&>(local_80,iVar4,&local_40);
                  }
                  else {
                    *iVar4._M_current = local_40;
                    pppCVar1 = &(local_90->gates).
                                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppCVar1 = *pppCVar1 + 1;
                  }
                  this = local_98;
                  pivot = local_a4;
                  iVar4._M_current =
                       (pEVar9->gates).
                       super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (pEVar9->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                    _M_realloc_insert<CaDiCaL::Clause*const&>(local_80,iVar4,&local_48);
                    pEVar9 = local_90;
                  }
                  else {
                    *iVar4._M_current = local_48;
                    pppCVar1 = &(pEVar9->gates).
                                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppCVar1 = *pppCVar1 + 1;
                  }
                  iVar4._M_current =
                       (pEVar9->gates).
                       super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (pEVar9->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                    _M_realloc_insert<CaDiCaL::Clause*const&>(local_80,iVar4,&local_50);
                    pEVar9 = local_90;
                  }
                  else {
                    *iVar4._M_current = local_50;
                    pppCVar1 = &(pEVar9->gates).
                                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppCVar1 = *pppCVar1 + 1;
                  }
                  iVar4._M_current =
                       (pEVar9->gates).
                       super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (pEVar9->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                    _M_realloc_insert<CaDiCaL::Clause*const&>(local_80,iVar4,&local_58);
                  }
                  else {
                    *iVar4._M_current = local_58;
                    pppCVar1 = &(pEVar9->gates).
                                super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppCVar1 = *pppCVar1 + 1;
                  }
                  piVar2 = &(this->stats).elimgates;
                  *piVar2 = *piVar2 + 1;
                  piVar2 = &(this->stats).elimites;
                  *piVar2 = *piVar2 + 1;
                  uVar6 = 1;
                }
              }
            }
            ppCVar11 = ppCVar11 + 1;
          } while (uVar6 == 7);
          if (uVar6 == 5) {
            uVar6 = 0;
          }
        }
      } while (((uVar6 & 3) == 0) && (local_38 = local_38 + 1, local_38 != local_60));
    }
  }
  return;
}

Assistant:

void Internal::find_if_then_else (Eliminator &eliminator, int pivot) {

  if (!opts.elimites)
    return;

  assert (opts.elimsubst);

  if (unsat)
    return;
  if (val (pivot))
    return;
  if (!eliminator.gates.empty ())
    return;

  const Occs &os = occs (pivot);
  const auto end = os.end ();
  for (auto i = os.begin (); i != end; i++) {
    Clause *di = *i;
    int ai, bi, ci;
    if (!get_ternary_clause (di, ai, bi, ci))
      continue;
    if (bi == pivot)
      swap (ai, bi);
    if (ci == pivot)
      swap (ai, ci);
    assert (ai == pivot);
    for (auto j = i + 1; j != end; j++) {
      Clause *dj = *j;
      int aj, bj, cj;
      if (!get_ternary_clause (dj, aj, bj, cj))
        continue;
      if (bj == pivot)
        swap (aj, bj);
      if (cj == pivot)
        swap (aj, cj);
      assert (aj == pivot);
      if (abs (bi) == abs (cj))
        swap (bj, cj);
      if (abs (ci) == abs (cj))
        continue;
      if (bi != -bj)
        continue;
      Clause *d1 = find_ternary_clause (-pivot, bi, -ci);
      if (!d1)
        continue;
      Clause *d2 = find_ternary_clause (-pivot, bj, -cj);
      if (!d2)
        continue;
      LOG (di, "1st if-then-else");
      LOG (dj, "2nd if-then-else");
      LOG (d1, "3rd if-then-else");
      LOG (d2, "4th if-then-else");
      LOG ("found ITE gate %d == (%d ? %d : %d)", pivot, -bi, -ci, -cj);
      assert (!di->gate);
      assert (!dj->gate);
      assert (!d1->gate);
      assert (!d2->gate);
      di->gate = true;
      dj->gate = true;
      d1->gate = true;
      d2->gate = true;
      eliminator.gates.push_back (di);
      eliminator.gates.push_back (dj);
      eliminator.gates.push_back (d1);
      eliminator.gates.push_back (d2);
      stats.elimgates++;
      stats.elimites++;
      return;
    }
  }
}